

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

void __thiscall xemmai::t_lexer::t_lexer(t_lexer *this,wstring_view a_path,FILE *a_stream)

{
  wint_t wVar1;
  allocator<wchar_t> local_29;
  FILE *local_28;
  FILE *a_stream_local;
  t_lexer *this_local;
  wstring_view a_path_local;
  
  a_path_local._M_len = (size_t)a_path._M_str;
  this_local = (t_lexer *)a_path._M_len;
  local_28 = a_stream;
  a_stream_local = (FILE *)this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)this,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local,
             &local_29);
  std::allocator<wchar_t>::~allocator(&local_29);
  this->v_stream = local_28;
  this->v_position = 0;
  this->v_line = 1;
  this->v_column = 1;
  wVar1 = getwc((__FILE *)this->v_stream);
  this->v_c = wVar1;
  (this->v_at).v_position = 0;
  (this->v_at).v_line = 0;
  (this->v_at).v_column = 0;
  t_stringer::t_stringer(&this->v_indent);
  t_stringer::t_stringer(&this->v_value);
  while( true ) {
    f_read_indent(this);
    if ((this->v_c != 10) && (this->v_c != 0x23)) break;
    t_stringer::f_rewind(&this->v_indent,0);
    f_skip_line(this);
  }
  f_next(this);
  return;
}

Assistant:

t_lexer::t_lexer(std::wstring_view a_path, std::FILE* a_stream) : v_path(a_path), v_stream(a_stream), v_c(std::getwc(v_stream))
{
	while (true) {
		f_read_indent();
		if (v_c != L'\n' && v_c != L'#') break;
		v_indent.f_rewind(0);
		f_skip_line();
	}
	f_next();
}